

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Atom.cpp
# Opt level: O3

void __thiscall mbc::Val::_ValAtom::_ValAtom(_ValAtom *this)

{
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar1;
  
  ValBase::ValBase(&this->super_ValBase);
  (this->super_ValBase)._vptr_ValBase = (_func_int **)&PTR___ValAtom_0013f630;
  pfVar1 = (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            *)operator_new(0x20);
  *(undefined8 *)&(pfVar1->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8) = 0;
  pfVar1->_M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Atom.cpp:25:29)>
       ::_M_invoke;
  (pfVar1->super__Function_base)._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Atom.cpp:25:29)>
       ::_M_manager;
  this->vaild_checker_ = pfVar1;
  *(this->super_ValBase).type_ = ATOM;
  return;
}

Assistant:

_ValAtom::_ValAtom() : ValBase() {
    vaild_checker_ = new std::function<bool(const string& str)>(
                            [](const string& str){return true;}
                     );
    *type_ = Type(ATOM);
}